

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

int Abc_NtkLevelReverse_rec(Abc_Obj_t *pNode)

{
  uint uVar1;
  int iVar2;
  Abc_Obj_t *pNode_00;
  uint uVar3;
  long lVar4;
  
  uVar3 = *(uint *)&pNode->field_0x14;
  uVar1 = uVar3 & 0xf;
  if (uVar1 == 6) {
    __assert_fail("!Abc_ObjIsNet(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                  ,0x56d,"int Abc_NtkLevelReverse_rec(Abc_Obj_t *)");
  }
  if (uVar1 - 5 < 0xfffffffe) {
    if ((uVar1 != 1) && (uVar1 != 7)) {
      __assert_fail("Abc_ObjIsNode( pNode ) || pNode->Type == ABC_OBJ_CONST1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                    ,0x571,"int Abc_NtkLevelReverse_rec(Abc_Obj_t *)");
    }
    iVar2 = Abc_NodeIsTravIdCurrent(pNode);
    if (iVar2 == 0) {
      Abc_NodeSetTravIdCurrent(pNode);
      uVar3 = *(uint *)&pNode->field_0x14 & 0xfff;
      *(uint *)&pNode->field_0x14 = uVar3;
      for (lVar4 = 0; lVar4 < (pNode->vFanouts).nSize; lVar4 = lVar4 + 1) {
        pNode_00 = Abc_ObjFanout0Ntk((Abc_Obj_t *)
                                     pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar4]]);
        uVar1 = Abc_NtkLevelReverse_rec(pNode_00);
        uVar3 = *(uint *)&pNode->field_0x14;
        if (uVar3 >> 0xc < uVar1) {
          uVar3 = uVar3 & 0xfff | uVar1 << 0xc;
          *(uint *)&pNode->field_0x14 = uVar3;
        }
      }
      if (0 < (pNode->vFanins).nSize) {
        iVar2 = Abc_ObjIsBarBuf(pNode);
        if (iVar2 == 0) {
          uVar3 = uVar3 + 0x1000;
          *(uint *)&pNode->field_0x14 = uVar3;
        }
      }
    }
    else {
      uVar3 = *(uint *)&pNode->field_0x14;
    }
  }
  return uVar3 >> 0xc;
}

Assistant:

int Abc_NtkLevelReverse_rec( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNext;
    int i, Level;
    assert( !Abc_ObjIsNet(pNode) );
    // skip the PI
    if ( Abc_ObjIsCo(pNode) )
        return pNode->Level;
    assert( Abc_ObjIsNode( pNode ) || pNode->Type == ABC_OBJ_CONST1);
    // if this node is already visited, return
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return pNode->Level;
    // mark the node as visited
    Abc_NodeSetTravIdCurrent( pNode );
    // visit the transitive fanin
    pNode->Level = 0;
    Abc_ObjForEachFanout( pNode, pNext, i )
    {
        Level = Abc_NtkLevelReverse_rec( Abc_ObjFanout0Ntk(pNext) );
        if ( pNode->Level < (unsigned)Level )
            pNode->Level = Level;
    }
    if ( Abc_ObjFaninNum(pNode) > 0 && !Abc_ObjIsBarBuf(pNode) )
        pNode->Level++;
    return pNode->Level;
}